

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmBrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelID,RegSlot R1,RegSlot R2)

{
  Data *this_00;
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  int5 local_38;
  undefined1 local_33;
  undefined2 uStack_32;
  OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_015b5fbd == '\0') && (DAT_015b5fbc == '\0')) && (R1 < 0x100)) {
    uStack_32 = (undefined2)((ulong)in_RAX >> 0x30);
    _local_38 = CONCAT15((char)R2,(uint5)(R1 & 0xff) << 0x20);
    if (R2 < 0x100) {
      _local_38 = CONCAT44(stack0xffffffffffffffcc,6);
      bVar3 = OpCodeUtilAsmJs::IsValidByteCodeOpcode(op);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/AsmJsByteCodeWriter.cpp"
                                    ,0x11,"(OpCodeUtilAsmJs::IsValidByteCodeOpcode(op))",
                                    "OpCodeUtilAsmJs::IsValidByteCodeOpcode(op)");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
      ByteCodeWriter::Data::EncodeOpCode<(Js::LayoutSize)0>(this_00,op,&this->super_ByteCodeWriter);
      if ((ushort)(op - StartCall) < 0xfff8) {
        puVar1 = &(this->super_ByteCodeWriter).m_byteCodeWithoutLDACount;
        *puVar1 = *puVar1 + 1;
      }
      ByteCodeWriter::IncreaseByteCodeCount(&this->super_ByteCodeWriter);
      ByteCodeWriter::Data::Write(this_00,&local_38,6);
      AddJumpOffset(this,EndOfBlock,labelID,6);
      return true;
    }
  }
  return false;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmBrReg2(OpCodeAsmJs op, ByteCodeLabel labelID, RegSlot R1, RegSlot R2)
    {
        OpLayoutT_BrInt2<SizePolicy> layout;
        if (SizePolicy::Assign(layout.I1, R1) && SizePolicy::Assign(layout.I2, R2))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrInt2<SizePolicy>) - offsetof(OpLayoutT_BrInt2<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }